

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_mod_2d(mp_int *a,int b,mp_int *c)

{
  mp_digit *pmVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  if (b < 1) {
    c->sign = 0;
    c->used = 0;
    if (0 < (long)c->alloc) {
      memset(c->dp,0,(long)c->alloc << 3);
      return 0;
    }
    return 0;
  }
  iVar5 = a->used;
  iVar4 = mp_copy(a,c);
  if (iVar4 != 0 || iVar5 * 0x3c <= b) {
    return iVar4;
  }
  uVar3 = (ulong)(uint)b / 0x3c;
  iVar5 = b + (int)uVar3 * -0x3c;
  uVar6 = c->used;
  pmVar1 = c->dp;
  if ((int)((uint)b / 0x3c + (uint)(iVar5 != 0)) < (int)uVar6) {
    uVar3 = (ulong)(uint)b / 0x3c;
    memset((void *)((ulong)((((uint)b / 0x3c + 1) - (uint)(iVar5 == 0)) * 8) + (long)pmVar1),0,
           (ulong)((~(uint)uVar3 + uVar6) - (uint)(iVar5 != 0)) * 8 + 8);
    pmVar1[uVar3] = pmVar1[uVar3] & ~(-1L << ((byte)iVar5 & 0x3f));
  }
  else {
    pmVar1[uVar3] = pmVar1[uVar3] & ~(-1L << ((byte)iVar5 & 0x3f));
    if ((int)uVar6 < 1) {
      if (uVar6 != 0) {
        return 0;
      }
      goto LAB_001041fb;
    }
  }
  do {
    if (pmVar1[(ulong)uVar6 - 1] != 0) {
      return 0;
    }
    c->used = uVar6 - 1;
    bVar2 = 1 < (int)uVar6;
    uVar6 = uVar6 - 1;
  } while (bVar2);
LAB_001041fb:
  c->sign = 0;
  return 0;
}

Assistant:

int mp_mod_2d (mp_int * a, int b, mp_int * c)
{
  int     x, res;

  /* if b is <= 0 then zero the int */
  if (b <= 0) {
    mp_zero (c);
    return MP_OKAY;
  }

  /* if the modulus is larger than the value than return */
  if (b >= (int) (a->used * DIGIT_BIT)) {
    res = mp_copy (a, c);
    return res;
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    return res;
  }

  /* zero digits above the last digit of the modulus */
  for (x = (b / DIGIT_BIT) + ((b % DIGIT_BIT) == 0 ? 0 : 1); x < c->used; x++) {
    c->dp[x] = 0;
  }
  /* clear the digit that is not completely outside/inside the modulus */
  c->dp[b / DIGIT_BIT] &=
    (mp_digit) ((((mp_digit) 1) << (((mp_digit) b) % DIGIT_BIT)) - ((mp_digit) 1));
  mp_clamp (c);
  return MP_OKAY;
}